

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O0

bool __thiscall csv::CSVReader::read_csv(CSVReader *this,size_t bytes)

{
  pointer pTVar1;
  pointer pIVar2;
  type rows;
  size_t bytes_local;
  CSVReader *this_local;
  
  pTVar1 = std::
           unique_ptr<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
           ::operator->(&this->records);
  internals::ThreadSafeDeque<csv::CSVRow>::notify_all(pTVar1);
  pIVar2 = std::
           unique_ptr<csv::internals::IBasicCSVParser,_std::default_delete<csv::internals::IBasicCSVParser>_>
           ::operator->(&this->parser);
  rows = std::
         unique_ptr<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
         ::operator*(&this->records);
  internals::IBasicCSVParser::set_output(pIVar2,rows);
  pIVar2 = std::
           unique_ptr<csv::internals::IBasicCSVParser,_std::default_delete<csv::internals::IBasicCSVParser>_>
           ::operator->(&this->parser);
  (*pIVar2->_vptr_IBasicCSVParser[2])(pIVar2,bytes);
  if ((this->header_trimmed & 1U) == 0) {
    trim_header(this);
  }
  pTVar1 = std::
           unique_ptr<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
           ::operator->(&this->records);
  internals::ThreadSafeDeque<csv::CSVRow>::kill_all(pTVar1);
  return true;
}

Assistant:

CSV_INLINE bool CSVReader::read_csv(size_t bytes) {
        // Tell read_row() to listen for CSV rows
        this->records->notify_all();

        this->parser->set_output(*this->records);
        this->parser->next(bytes);

        if (!this->header_trimmed) {
            this->trim_header();
        }

        // Tell read_row() to stop waiting
        this->records->kill_all();

        return true;
    }